

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int aes_cbc_encrypt(aes_context *ctx,uint8_t *iv,uint8_t *input,size_t length,uint8_t *output)

{
  int local_3c;
  uint8_t *puStack_38;
  int i;
  uint8_t *output_local;
  size_t length_local;
  uint8_t *input_local;
  uint8_t *iv_local;
  aes_context *ctx_local;
  
  puStack_38 = output;
  output_local = (uint8_t *)length;
  length_local = (size_t)input;
  if ((length & 0xf) == 0) {
    for (; output_local != (uint8_t *)0x0; output_local = output_local + -0x10) {
      for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
        puStack_38[local_3c] = *(byte *)(length_local + (long)local_3c) ^ iv[local_3c];
      }
      aes_ecb_encrypt(ctx,puStack_38,puStack_38);
      *(undefined8 *)iv = *(undefined8 *)puStack_38;
      *(undefined8 *)(iv + 8) = *(undefined8 *)(puStack_38 + 8);
      length_local = length_local + 0x10;
      puStack_38 = puStack_38 + 0x10;
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = -1;
  }
  return ctx_local._4_4_;
}

Assistant:

int aes_cbc_encrypt(const aes_context* ctx, uint8_t iv[16], const uint8_t* input, size_t length, uint8_t* output) {
    int i;

    if (length % 16)
        return -1;
    while (length > 0) {
        for (i = 0; i < 16; i++)
            output[i] = (unsigned char)(input[i] ^ iv[i]);

        aes_ecb_encrypt(ctx, output, output);
        memcpy(iv, output, 16);

        input += 16;
        output += 16;
        length -= 16;
    }
    return 0;
}